

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O0

vector<merlin::factor,_std::allocator<merlin::factor>_> * __thiscall
merlin::graphical_model::assert_evidence
          (vector<merlin::factor,_std::allocator<merlin::factor>_> *__return_storage_ptr__,
          graphical_model *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *evidence,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *old_to_new)

{
  ulong uVar1;
  const_iterator ci_00;
  const_iterator ci_01;
  bool bVar2;
  reference f_00;
  pointer ppVar3;
  size_t sVar4;
  ostream *poVar5;
  runtime_error *this_00;
  factor *pfVar6;
  reference this_01;
  variable_set *pvVar7;
  variable *pvVar8;
  mapped_type *pmVar9;
  value *t;
  variable vVar10;
  factor local_500;
  variable local_4a0;
  size_t local_490;
  vindex new_idx;
  size_t dim;
  vindex old_idx;
  variable_set *pvStack_470;
  size_t local_468;
  size_t sStack_460;
  undefined1 local_458 [8];
  const_iterator ci_1;
  variable_set vs;
  factor *f_1;
  size_t i;
  size_t local_3e8;
  const_iterator local_3e0;
  undefined1 local_3c0 [8];
  const_iterator ci;
  vindex idx;
  size_t local_390;
  variable_set local_388;
  factor local_350;
  variable local_2f0;
  undefined1 local_2d9;
  string local_2d8 [32];
  stringstream local_2b8 [8];
  stringstream ss;
  ostream local_2a8 [376];
  variable local_130;
  ulong local_120;
  size_t k;
  size_t v;
  _Self local_108;
  const_iterator mi;
  undefined1 local_f0 [8];
  factor f;
  __normal_iterator<merlin::factor_*,_std::vector<merlin::factor,_std::allocator<merlin::factor>_>_>
  local_88;
  __normal_iterator<const_merlin::factor_*,_std::vector<merlin::factor,_std::allocator<merlin::factor>_>_>
  local_80;
  const_iterator it;
  vector<merlin::factor,_std::allocator<merlin::factor>_> temp;
  variable_set non_evid_vars;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *old_to_new_local;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *evidence_local;
  graphical_model *this_local;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *result;
  
  variable_set::variable_set
            ((variable_set *)
             &temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)&it);
  local_88._M_current =
       (factor *)
       std::vector<merlin::factor,_std::allocator<merlin::factor>_>::begin(&this->m_factors);
  __gnu_cxx::
  __normal_iterator<merlin::factor_const*,std::vector<merlin::factor,std::allocator<merlin::factor>>>
  ::__normal_iterator<merlin::factor*>
            ((__normal_iterator<merlin::factor_const*,std::vector<merlin::factor,std::allocator<merlin::factor>>>
              *)&local_80,&local_88);
  do {
    f._88_8_ = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::end(&this->m_factors);
    bVar2 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<merlin::factor_*,_std::vector<merlin::factor,_std::allocator<merlin::factor>_>_>
                        *)&f.c_);
    if (!bVar2) {
      ci.m_tmp.m_states = 0;
      variable_set::begin((const_iterator *)local_3c0,
                          (variable_set *)
                          &temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        variable_set::end(&local_3e0,
                          (variable_set *)
                          &temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
        ci_00.m_vs = local_3e0.m_vs;
        ci_00.m_i = local_3e0.m_i;
        ci_00.m_tmp.m_label = local_3e0.m_tmp.m_label;
        ci_00.m_tmp.m_states = local_3e0.m_tmp.m_states;
        bVar2 = variable_set::const_iterator::operator!=((const_iterator *)local_3c0,ci_00);
        sVar4 = ci.m_tmp.m_states;
        if (!bVar2) break;
        pvVar8 = variable_set::const_iterator::operator->((const_iterator *)local_3c0);
        local_3e8 = variable::label(pvVar8);
        pmVar9 = std::
                 map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[](old_to_new,&local_3e8);
        *pmVar9 = sVar4;
        ci.m_tmp.m_states = ci.m_tmp.m_states + 1;
        variable_set::const_iterator::operator++((const_iterator *)local_3c0);
      }
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector(__return_storage_ptr__);
      f_1 = (factor *)0x0;
      while( true ) {
        pfVar6 = (factor *)
                 std::vector<merlin::factor,_std::allocator<merlin::factor>_>::size
                           ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)&it);
        if (pfVar6 <= f_1) break;
        this_01 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                            ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)&it,
                             (size_type)f_1);
        variable_set::variable_set((variable_set *)&ci_1.m_tmp.m_states);
        pvVar7 = factor::vars(this_01);
        variable_set::begin((const_iterator *)local_458,pvVar7);
        while( true ) {
          pvVar7 = factor::vars(this_01);
          variable_set::end((const_iterator *)&old_idx,pvVar7);
          ci_01.m_vs = pvStack_470;
          ci_01.m_i = old_idx;
          ci_01.m_tmp.m_label = local_468;
          ci_01.m_tmp.m_states = sStack_460;
          bVar2 = variable_set::const_iterator::operator!=((const_iterator *)local_458,ci_01);
          if (!bVar2) break;
          pvVar8 = variable_set::const_iterator::operator->((const_iterator *)local_458);
          dim = variable::label(pvVar8);
          pvVar8 = variable_set::const_iterator::operator->((const_iterator *)local_458);
          new_idx = variable::states(pvVar8);
          pmVar9 = std::
                   map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::operator[](old_to_new,&dim);
          local_490 = *pmVar9;
          variable::variable(&local_4a0,local_490,new_idx);
          variable_set::operator|=((variable_set *)&ci_1.m_tmp.m_states,&local_4a0);
          variable_set::const_iterator::operator++((const_iterator *)local_458);
        }
        t = factor::table(this_01);
        factor::factor(&local_500,(variable_set *)&ci_1.m_tmp.m_states,t);
        std::vector<merlin::factor,_std::allocator<merlin::factor>_>::push_back
                  (__return_storage_ptr__,&local_500);
        factor::~factor(&local_500);
        variable_set::~variable_set((variable_set *)&ci_1.m_tmp.m_states);
        f_1 = (factor *)((long)&f_1->_vptr_factor + 1);
      }
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)&it);
      variable_set::~variable_set
                ((variable_set *)
                 &temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    f_00 = __gnu_cxx::
           __normal_iterator<const_merlin::factor_*,_std::vector<merlin::factor,_std::allocator<merlin::factor>_>_>
           ::operator*(&local_80);
    factor::factor((factor *)local_f0,f_00);
    local_108._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::begin(evidence);
    while( true ) {
      v = (size_t)std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::end(evidence);
      bVar2 = std::operator!=(&local_108,(_Self *)&v);
      if (!bVar2) break;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
               operator->(&local_108);
      k = ppVar3->first;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
               operator->(&local_108);
      uVar1 = ppVar3->second;
      local_120 = uVar1;
      vVar10 = var(this,k);
      local_130 = vVar10;
      sVar4 = variable::states(&local_130);
      if (sVar4 <= uVar1) {
        std::__cxx11::stringstream::stringstream(local_2b8);
        poVar5 = std::operator<<(local_2a8,"Evidence value ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_120);
        poVar5 = std::operator<<(poVar5," is outside variable\'s x");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,k);
        std::operator<<(poVar5," domain.");
        local_2d9 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(this_00,local_2d8);
        local_2d9 = 0;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar7 = factor::vars((factor *)local_f0);
      vVar10 = var(this,k);
      local_2f0 = vVar10;
      bVar2 = variable_set::contains(pvVar7,&local_2f0);
      if (bVar2) {
        vVar10 = var(this,k);
        local_390 = vVar10.m_states;
        idx = vVar10.m_label;
        variable_set::variable_set(&local_388,(variable *)&idx);
        factor::condition(&local_350,(factor *)local_f0,&local_388,local_120);
        factor::operator=((factor *)local_f0,&local_350);
        factor::~factor(&local_350);
        variable_set::~variable_set(&local_388);
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
                (&local_108);
    }
    bVar2 = factor::isscalar((factor *)local_f0);
    if (bVar2) {
      factor::operator*=(&this->m_global_const,(factor *)local_f0);
    }
    else {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::push_back
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)&it,
                 (value_type *)local_f0);
      pvVar7 = factor::vars((factor *)local_f0);
      variable_set::operator|=
                ((variable_set *)
                 &temp.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pvVar7);
    }
    factor::~factor((factor *)local_f0);
    __gnu_cxx::
    __normal_iterator<const_merlin::factor_*,_std::vector<merlin::factor,_std::allocator<merlin::factor>_>_>
    ::operator++(&local_80);
  } while( true );
}

Assistant:

std::vector<factor> assert_evidence(const std::map<size_t, size_t>& evidence,
			std::map<size_t, size_t>& old_to_new) {

		// Condition the factors on the evidence, and accumulate the constant
		variable_set non_evid_vars;
		std::vector<factor> temp;
		std::vector<factor>::const_iterator it = m_factors.begin();
		for (; it != m_factors.end(); ++it) {
			factor f = (*it);
			for (std::map<size_t, size_t>::const_iterator mi = evidence.begin();
					mi != evidence.end(); ++mi) {
				size_t v = mi->first;
				size_t k = mi->second;

				// check if value is in domain
				if (k >= var(v).states()) {
					std::stringstream ss;
					ss << "Evidence value " << k << " is outside variable's x"
						<< v << " domain.";
					throw std::runtime_error(ss.str());
				}

				if (f.vars().contains(var(v))) {
					f = f.condition(var(v), k);
				}
			}

			if (f.isscalar()) {
				m_global_const *= f; // accumulate the global constant
			} else {
				temp.push_back(f);
				non_evid_vars |= f.vars();
			}
		}

		// Re-index the non-evidence variables
		vindex idx = 0;
		for (variable_set::const_iterator ci = non_evid_vars.begin();
				ci != non_evid_vars.end(); ++ci) {
			old_to_new[ci->label()] = idx;
			++idx;
		}

		std::vector<factor> result;
		for (size_t i = 0; i < temp.size(); ++i) {
			const factor& f = temp[i];
			variable_set vs;
			for (variable_set::const_iterator ci = f.vars().begin();
					ci != f.vars().end(); ++ci) {
				vindex old_idx = ci->label();
				size_t dim = ci->states();
				vindex new_idx = old_to_new[old_idx];
				vs |= variable(new_idx, dim);
			}

			result.push_back(factor(vs, (double*)f.table()));
		}

		return result;
	}